

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDEdge * __thiscall ON_SubDFace::PrevEdge(ON_SubDFace *this,ON_SubDEdge *edge)

{
  uint uVar1;
  uint edge_count;
  uint edge_index;
  ON_SubDEdge *edge_local;
  ON_SubDFace *this_local;
  
  uVar1 = EdgeArrayIndex(this,edge);
  if (uVar1 == 0xffffffff) {
    this_local = (ON_SubDFace *)0x0;
  }
  else {
    this_local = (ON_SubDFace *)
                 Edge(this,(uVar1 + (this->m_edge_count - 1)) % (uint)this->m_edge_count);
  }
  return (ON_SubDEdge *)this_local;
}

Assistant:

const ON_SubDEdge* ON_SubDFace::PrevEdge(
  const ON_SubDEdge* edge
  ) const
{
  unsigned int edge_index = EdgeArrayIndex(edge);
  if (ON_UNSET_UINT_INDEX == edge_index)
    return nullptr;
  const unsigned int edge_count = m_edge_count;
  edge_index = (edge_index + (edge_count - 1)) % edge_count;
  return Edge(edge_index);
}